

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progressbar.cpp
# Opt level: O3

void __thiscall QtMWidgets::ProgressBar::setValue(ProgressBar *this,int value)

{
  int iVar1;
  bool bVar2;
  ProgressBarPrivate *pPVar3;
  QAccessibleValueChangeEvent event;
  QVariant QStack_78;
  code *local_58;
  undefined4 local_50;
  ProgressBar *local_48;
  undefined4 local_40;
  QVariant local_38;
  
  pPVar3 = (this->d).d;
  iVar1 = pPVar3->minimum;
  if (iVar1 + -1 == value) {
    reset(this);
    return;
  }
  if ((pPVar3->value != value) &&
     (iVar1 <= value && value <= pPVar3->maximum || pPVar3->maximum == 0 && iVar1 == 0)) {
    pPVar3->value = value;
    valueChanged(this,value);
    if ((*(byte *)(*(long *)&this->field_0x20 + 9) & 0x80) != 0) {
      QVariant::QVariant(&QStack_78,value);
      local_50 = 0x80c1;
      local_40 = 0xffffffff;
      local_58 = QStaticText::setTextWidth;
      local_48 = this;
      QVariant::QVariant(&local_38,&QStack_78);
      local_50 = 0x800e;
      QVariant::~QVariant(&QStack_78);
      QAccessible::updateAccessibility((QAccessibleEvent *)&local_58);
      QAccessibleValueChangeEvent::~QAccessibleValueChangeEvent
                ((QAccessibleValueChangeEvent *)&local_58);
    }
    pPVar3 = (this->d).d;
    bVar2 = ProgressBarPrivate::repaintRequired(pPVar3);
    if (bVar2) {
      QWidget::repaint();
      pPVar3 = (this->d).d;
    }
    if (pPVar3->animate == true) {
      pPVar3->animate = false;
      QAbstractAnimation::stop();
      QWidget::repaint();
    }
  }
  return;
}

Assistant:

void
ProgressBar::setValue( int value )
{
	if( value == d->minimum - 1 )
	{
		reset();

		return;
	}

	if( d->value == value
		|| ( ( value > d->maximum || value < d->minimum )
			&& ( d->maximum != 0 || d->minimum != 0 ) ) )
		return;

	d->value = value;

	emit valueChanged( value );

#ifndef QT_NO_ACCESSIBILITY
	if( isVisible() )
	{
		QAccessibleValueChangeEvent event( this, value );
		QAccessible::updateAccessibility( &event );
	}
#endif

	if( d->repaintRequired() )
		repaint();

	if( d->animate )
	{
		d->animate = false;

		d->animation->stop();

		repaint();
	}
}